

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O3

void __thiscall cmGraphVizWriter::WriteTargetDependersFiles(cmGraphVizWriter *this,char *fileName)

{
  _Rb_tree_header *p_Var1;
  char cVar2;
  ostream *poVar3;
  _Base_ptr p_Var4;
  cmGraphVizWriter *this_00;
  string currentFilename;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  insertedNodes;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  insertedConnections;
  cmGeneratedFileStream str;
  long *local_300;
  long local_2f8;
  long local_2f0 [2];
  char *local_2e0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2d8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2a8;
  undefined1 local_278 [584];
  
  if (this->GenerateDependers != false) {
    local_2e0 = fileName;
    CollectTargetsAndLibs(this);
    p_Var4 = (this->TargetPtrs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->TargetPtrs)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var4 != p_Var1) {
      do {
        if (*(long *)(p_Var4 + 2) != 0) {
          switch(*(undefined4 *)(*(long *)(p_Var4 + 2) + 0x2e0)) {
          case 0:
            if (this->GenerateForExecutables != true) goto switchD_004601d5_default;
            goto LAB_00460212;
          case 1:
            cVar2 = this->GenerateForStaticLibs;
            break;
          case 2:
            cVar2 = this->GenerateForSharedLibs;
            break;
          case 3:
            cVar2 = this->GenerateForModuleLibs;
            break;
          default:
            goto switchD_004601d5_default;
          }
          if (cVar2 != '\0') {
LAB_00460212:
            std::__cxx11::string::string((string *)&local_300,local_2e0,(allocator *)local_278);
            std::__cxx11::string::append((char *)&local_300);
            std::__cxx11::string::_M_append((char *)&local_300,*(ulong *)(p_Var4 + 1));
            std::__cxx11::string::append((char *)&local_300);
            cmGeneratedFileStream::cmGeneratedFileStream
                      ((cmGeneratedFileStream *)local_278,(char *)local_300,false);
            if (((byte)(*(_func_int **)(local_278._0_8_ + -0x18))[(long)(local_278 + 0x20)] & 5) !=
                0) {
              cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
              if (local_300 == local_2f0) {
                return;
              }
              operator_delete(local_300,local_2f0[0] + 1);
              return;
            }
            local_2a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            local_2a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_2a8._M_impl.super__Rb_tree_header._M_header._M_left =
                 &local_2a8._M_impl.super__Rb_tree_header._M_header;
            local_2a8._M_impl.super__Rb_tree_header._M_node_count = 0;
            local_2d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            local_2d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_2d8._M_impl.super__Rb_tree_header._M_header._M_left =
                 &local_2d8._M_impl.super__Rb_tree_header._M_header;
            local_2d8._M_impl.super__Rb_tree_header._M_node_count = 0;
            local_2d8._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_2d8._M_impl.super__Rb_tree_header._M_header._M_left;
            local_2a8._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_2a8._M_impl.super__Rb_tree_header._M_header._M_left;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Writing ",8);
            poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,(char *)local_300,local_2f8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"...",3);
            std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
            std::ostream::put((char)poVar3);
            std::ostream::flush();
            WriteHeader(this,(cmGeneratedFileStream *)local_278);
            this_00 = this;
            WriteDependerConnections
                      (this,(string *)(p_Var4 + 1),
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_2d8,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_2a8,(cmGeneratedFileStream *)local_278);
            WriteFooter(this_00,(cmGeneratedFileStream *)local_278);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~_Rb_tree(&local_2d8);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~_Rb_tree(&local_2a8);
            cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
            if (local_300 != local_2f0) {
              operator_delete(local_300,local_2f0[0] + 1);
            }
          }
        }
switchD_004601d5_default:
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
      } while ((_Rb_tree_header *)p_Var4 != p_Var1);
    }
  }
  return;
}

Assistant:

void cmGraphVizWriter::WriteTargetDependersFiles(const char* fileName)
{
  if(this->GenerateDependers == false)
    {
    return;
    }

  this->CollectTargetsAndLibs();

  for(std::map<std::string, const cmTarget*>::const_iterator ptrIt =
                                                      this->TargetPtrs.begin();
      ptrIt != this->TargetPtrs.end();
      ++ptrIt)
    {
    if (ptrIt->second == NULL)
      {
      continue;
      }

    if (this->GenerateForTargetType(ptrIt->second->GetType()) == false)
      {
      continue;
      }

    std::string currentFilename = fileName;
    currentFilename += ".";
    currentFilename += ptrIt->first;
    currentFilename += ".dependers";

    cmGeneratedFileStream str(currentFilename.c_str());
    if ( !str )
      {
      return;
      }

    std::set<std::string> insertedConnections;
    std::set<std::string> insertedNodes;

    std::cout << "Writing " << currentFilename << "..." << std::endl;
    this->WriteHeader(str);

    this->WriteDependerConnections(ptrIt->first,
                                   insertedNodes, insertedConnections, str);

    this->WriteFooter(str);
    }
}